

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::write_to_file
          (mipmapped_texture *this,char *pFilename,format file_format,crn_comp_params *pComp_params,
          uint32 *pActual_quality_level,float *pActual_bitrate,uint32 image_write_flags)

{
  bool bVar1;
  uint uVar2;
  char *p;
  undefined1 local_c0 [8];
  data_stream_serializer serializer;
  dynamic_string local_a8 [2];
  undefined1 local_88 [8];
  cfile_stream write_stream;
  bool success;
  float *pActual_bitrate_local;
  uint32 *pActual_quality_level_local;
  crn_comp_params *pComp_params_local;
  format file_format_local;
  char *pFilename_local;
  mipmapped_texture *this_local;
  
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  bVar1 = is_valid(this);
  if (bVar1) {
    pComp_params_local._4_4_ = file_format;
    if (file_format == cFormatInvalid) {
      pComp_params_local._4_4_ = texture_file_types::determine_file_format(pFilename);
    }
    if (pComp_params_local._4_4_ == cFormatInvalid) {
      set_last_error(this,"Unknown file format");
      this_local._7_1_ = 0;
    }
    else {
      write_stream._63_1_ = 0;
      if (((pComp_params == (crn_comp_params *)0x0) || (pComp_params_local._4_4_ != cFormatDDS)) &&
         (pComp_params_local._4_4_ != cFormatCRN)) {
        bVar1 = texture_file_types::supports_mipmaps(pComp_params_local._4_4_);
        if (bVar1) {
          if (pComp_params != (crn_comp_params *)0x0) {
            console::warning(
                            "mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type)."
                            );
          }
          cfile_stream::cfile_stream((cfile_stream *)local_88);
          uVar2 = cfile_stream::open((cfile_stream *)local_88,pFilename,6,0);
          if ((uVar2 & 1) == 0) {
            dynamic_string::dynamic_string
                      (local_a8,cVarArg,"Failed creating output file \"%s\"",pFilename);
            p = dynamic_string::get_ptr(local_a8);
            set_last_error(this,p);
            dynamic_string::~dynamic_string(local_a8);
            this_local._7_1_ = 0;
            serializer._12_4_ = 1;
          }
          else {
            data_stream_serializer::data_stream_serializer
                      ((data_stream_serializer *)local_c0,(data_stream *)local_88);
            if (pComp_params_local._4_4_ == cFormatDDS) {
              write_stream._63_1_ = write_dds(this,(data_stream_serializer *)local_c0);
            }
            else if (pComp_params_local._4_4_ == cFormatKTX) {
              write_stream._63_1_ = write_ktx(this,(data_stream_serializer *)local_c0);
            }
            serializer._12_4_ = 0;
          }
          cfile_stream::~cfile_stream((cfile_stream *)local_88);
          if (serializer._12_4_ != 0) goto LAB_00151836;
        }
        else {
          write_stream._63_1_ = write_regular_image(this,pFilename,image_write_flags);
        }
      }
      else {
        if (pComp_params == (crn_comp_params *)0x0) {
          this_local._7_1_ = 0;
          goto LAB_00151836;
        }
        write_stream._63_1_ =
             write_comp_texture(this,pFilename,pComp_params,pActual_quality_level,pActual_bitrate);
      }
      this_local._7_1_ = write_stream._63_1_ & 1;
    }
  }
  else {
    set_last_error(this,"Unable to write empty texture");
    this_local._7_1_ = 0;
  }
LAB_00151836:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool mipmapped_texture::write_to_file(
    const char* pFilename,
    texture_file_types::format file_format,
    crn_comp_params* pComp_params,
    uint32* pActual_quality_level, float* pActual_bitrate,
    uint32 image_write_flags) {
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if (!is_valid()) {
    set_last_error("Unable to write empty texture");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(pFilename);

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unknown file format");
    return false;
  }

  bool success = false;

  if (((pComp_params) && (file_format == texture_file_types::cFormatDDS)) ||
      (file_format == texture_file_types::cFormatCRN)) {
    if (!pComp_params)
      return false;
    success = write_comp_texture(pFilename, *pComp_params, pActual_quality_level, pActual_bitrate);
  } else if (!texture_file_types::supports_mipmaps(file_format)) {
    success = write_regular_image(pFilename, image_write_flags);
  } else {
    if (pComp_params) {
      console::warning("mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type).");
    }

    cfile_stream write_stream;
    if (!write_stream.open(pFilename, cDataStreamWritable | cDataStreamSeekable)) {
      set_last_error(dynamic_string(cVarArg, "Failed creating output file \"%s\"", pFilename).get_ptr());
      return false;
    }
    data_stream_serializer serializer(write_stream);

    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = write_dds(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = write_ktx(serializer);
        break;
      }
      default: {
        break;
      }
    }
  }

  return success;
}